

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

xmlXPathObjectPtr xmlXPtrNewRangeNodePoint(xmlNodePtr start,xmlXPathObjectPtr end)

{
  xmlXPathObjectPtr range;
  
  if ((end == (xmlXPathObjectPtr)0x0 || start == (xmlNodePtr)0x0) || (end->type != XPATH_POINT)) {
    range = (xmlXPathObjectPtr)0x0;
  }
  else {
    range = xmlXPtrNewRangeInternal(start,-1,(xmlNodePtr)end->user,end->index);
    xmlXPtrRangeCheckOrder(range);
  }
  return range;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewRangeNodePoint(xmlNodePtr start, xmlXPathObjectPtr end) {
    xmlXPathObjectPtr ret;

    if (start == NULL)
	return(NULL);
    if (end == NULL)
	return(NULL);
    if (end->type != XPATH_POINT)
	return(NULL);

    ret = xmlXPtrNewRangeInternal(start, -1, end->user, end->index);
    xmlXPtrRangeCheckOrder(ret);
    return(ret);
}